

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O1

pboolean p_tree_rb_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key,
                         ppointer value)

{
  PTreeBaseNode *pPVar1;
  PTreeRBNode_ *node;
  PTreeRBNode *node_00;
  PTreeRBNode *pPVar2;
  pint pVar3;
  PTreeBaseNode_ *pPVar4;
  PTreeRBNode *pPVar5;
  PTreeBaseNode_ *pPVar6;
  PTreeRBNode *pPVar7;
  PTreeBaseNode *pPVar8;
  
  pPVar1 = *root_node;
  pPVar8 = pPVar1;
  pPVar6 = (PTreeBaseNode_ *)root_node;
  while (pPVar1 != (PTreeBaseNode *)0x0) {
    pVar3 = (*compare_func)(key,pPVar1->key,data);
    if (pVar3 < 0) {
      pPVar6 = pPVar6->left;
      pPVar8 = pPVar6;
    }
    else {
      if (pVar3 == 0) break;
      pPVar8 = pPVar6->left;
      pPVar6 = (PTreeBaseNode_ *)&pPVar8->right;
    }
    pPVar1 = pPVar6->left;
  }
  if (pPVar6->left == (PTreeBaseNode_ *)0x0) {
    pPVar4 = (PTreeBaseNode_ *)p_malloc0(0x30);
    pPVar6->left = pPVar4;
    if (pPVar4 != (PTreeBaseNode_ *)0x0) {
      pPVar4->key = key;
      pPVar6->left->value = value;
      pPVar4 = pPVar6->left;
      *(undefined4 *)&pPVar4[1].right = 1;
      pPVar4[1].left = pPVar8;
      node = (*(PTreeRBNode **)pPVar6)->parent;
      pPVar7 = *(PTreeRBNode **)pPVar6;
      while( true ) {
        if (node == (PTreeRBNode *)0x0) {
          pPVar7->color = P_TREE_RB_COLOR_BLACK;
          return 1;
        }
        if ((node->color & P_TREE_RB_COLOR_BLACK) != 0) break;
        node_00 = node->parent;
        pPVar2 = (PTreeRBNode *)(node_00->base).left;
        pPVar5 = pPVar2;
        if (pPVar2 == node) {
          pPVar5 = (PTreeRBNode *)(node_00->base).right;
        }
        if ((pPVar5 == (PTreeRBNode *)0x0) || ((pPVar5->color & P_TREE_RB_COLOR_RED) == 0)) {
          if (pPVar2 == node) {
            if (pPVar7 == (PTreeRBNode *)(node->base).right) {
              pp_tree_rb_rotate_left(node,root_node);
              pPVar7 = (PTreeRBNode *)(pPVar7->base).left;
            }
            node_00->color = P_TREE_RB_COLOR_RED;
            pPVar7->parent->color = P_TREE_RB_COLOR_BLACK;
            pp_tree_rb_rotate_right(node_00,root_node);
            return 1;
          }
          if (pPVar7 == (PTreeRBNode *)(node->base).left) {
            pp_tree_rb_rotate_right(node,root_node);
            pPVar7 = (PTreeRBNode *)(pPVar7->base).right;
          }
          node_00->color = P_TREE_RB_COLOR_RED;
          pPVar7->parent->color = P_TREE_RB_COLOR_BLACK;
          pp_tree_rb_rotate_left(node_00,root_node);
          return 1;
        }
        node->color = P_TREE_RB_COLOR_BLACK;
        pPVar5->color = P_TREE_RB_COLOR_BLACK;
        node_00->color = P_TREE_RB_COLOR_RED;
        node = node_00->parent;
        pPVar7 = node_00;
      }
      return 1;
    }
  }
  else {
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(pPVar6->left->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(pPVar6->left->value);
    }
    pPVar6->left->key = key;
    pPVar6->left->value = value;
  }
  return 0;
}

Assistant:

pboolean
p_tree_rb_insert (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  ppointer		key,
		  ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeRBNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeRBNode *) *cur_node)->color  = P_TREE_RB_COLOR_RED;
	((PTreeRBNode *) *cur_node)->parent = (PTreeRBNode *) parent_node;

	/* Balance the tree */
	pp_tree_rb_balance_insert ((PTreeRBNode *) *cur_node, root_node);

	return TRUE;
}